

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O0

Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
* __thiscall
testing::internal::WithArgsAction::operator_cast_to_Action
          (Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&)>
           *__return_storage_ptr__,WithArgsAction *this)

{
  anon_class_32_1_00c01032 local_58;
  undefined1 local_38 [8];
  Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> converted;
  WithArgsAction<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread[P]ot_commissioner_src_app_cli_job_manager_test_cpp:474:30),_0UL>
  *this_local;
  
  converted.fun_._M_invoker = (_Invoker_type)this;
  Action<void(std::shared_ptr<ot::commissioner::CommissionerApp>&)>::
  Action<JobManagerTestSuite_MalformedCredentialsJobCreateFailsByName_Test::TestBody()::__0_const&,void>
            ((Action<void(std::shared_ptr<ot::commissioner::CommissionerApp>&)> *)local_38,
             (anon_class_16_2_c9c4efc7_for_action *)this);
  Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)>::Action
            (&local_58.converted,
             (Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)local_38);
  testing::Action::Action(testing::internal::WithArgsAction::operator_cast_to_Action
            ((WithArgsAction *)__return_storage_ptr__,&local_58);
  WithArgsAction<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/app/cli/job_manager_test.cpp:474:30),_0UL>
  ::
  operator_Action<void,_std::shared_ptr<ot::commissioner::CommissionerApp>_&,_const_ot::commissioner::Config_&>
  ::anon_class_32_1_00c01032::
  ~_lambda_at__workspace_llm4binary_github_license_c_cmakelists_openthread_P_ot_commissioner_third_party_googletest_repo_googlemock_include_gmock_gmock_actions_h_1026_12_
            (&local_58);
  Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)>::~Action
            ((Action<void_(std::shared_ptr<ot::commissioner::CommissionerApp>_&)> *)local_38);
  return __return_storage_ptr__;
}

Assistant:

operator Action<R(Args...)>() const {  // NOLINT
    using TupleType = std::tuple<Args...>;
    Action<R(typename std::tuple_element<I, TupleType>::type...)>
        converted(action);

    return [converted](Args... args) -> R {
      return converted.Perform(std::forward_as_tuple(
        std::get<I>(std::forward_as_tuple(std::forward<Args>(args)...))...));
    };
  }